

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_vhost.c
# Opt level: O2

int str_to_regex(char *str,regex_t *reg)

{
  char *pcVar1;
  re_t __src;
  void *pvVar2;
  
  pcVar1 = str;
  do {
    if (*pcVar1 == ' ') {
      *pcVar1 = '|';
    }
    else if (*pcVar1 == '\0') {
      __src = re_compile(str);
      pvVar2 = memcpy(reg,__src,0x2000);
      return (int)pvVar2;
    }
    pcVar1 = pcVar1 + 1;
  } while( true );
}

Assistant:

static int str_to_regex(char *str, regex_t *reg)
{
    char *p = str;
    regex_t *result;

    while (*p) {
        if (*p == ' ') *p = '|';
        p++;
    }

    result = re_compile(str);

    memcpy(reg, result, REGEXP_SIZE);

    return 0;
}